

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RPLIDAR.h
# Opt level: O2

int GetExpressScanDataResponseRPLIDAR
              (RPLIDAR *pRPLIDAR,double *pDistances,double *pAngles,BOOL *pbNewScan)

{
  byte bVar1;
  byte bVar2;
  double dVar3;
  ushort uVar4;
  byte bVar5;
  int iVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  uchar *puVar11;
  long lVar12;
  uchar *puVar13;
  byte bVar14;
  double dVar15;
  double dVar16;
  uchar databuf [84];
  
  bVar14 = 0;
  databuf[0x40] = '\0';
  databuf[0x41] = '\0';
  databuf[0x42] = '\0';
  databuf[0x43] = '\0';
  databuf[0x44] = '\0';
  databuf[0x45] = '\0';
  databuf[0x46] = '\0';
  databuf[0x47] = '\0';
  databuf[0x48] = '\0';
  databuf[0x49] = '\0';
  databuf[0x4a] = '\0';
  databuf[0x4b] = '\0';
  databuf[0x4c] = '\0';
  databuf[0x4d] = '\0';
  databuf[0x4e] = '\0';
  databuf[0x4f] = '\0';
  databuf[0x30] = '\0';
  databuf[0x31] = '\0';
  databuf[0x32] = '\0';
  databuf[0x33] = '\0';
  databuf[0x34] = '\0';
  databuf[0x35] = '\0';
  databuf[0x36] = '\0';
  databuf[0x37] = '\0';
  databuf[0x38] = '\0';
  databuf[0x39] = '\0';
  databuf[0x3a] = '\0';
  databuf[0x3b] = '\0';
  databuf[0x3c] = '\0';
  databuf[0x3d] = '\0';
  databuf[0x3e] = '\0';
  databuf[0x3f] = '\0';
  databuf[0x20] = '\0';
  databuf[0x21] = '\0';
  databuf[0x22] = '\0';
  databuf[0x23] = '\0';
  databuf[0x24] = '\0';
  databuf[0x25] = '\0';
  databuf[0x26] = '\0';
  databuf[0x27] = '\0';
  databuf[0x28] = '\0';
  databuf[0x29] = '\0';
  databuf[0x2a] = '\0';
  databuf[0x2b] = '\0';
  databuf[0x2c] = '\0';
  databuf[0x2d] = '\0';
  databuf[0x2e] = '\0';
  databuf[0x2f] = '\0';
  databuf[0x10] = '\0';
  databuf[0x11] = '\0';
  databuf[0x12] = '\0';
  databuf[0x13] = '\0';
  databuf[0x14] = '\0';
  databuf[0x15] = '\0';
  databuf[0x16] = '\0';
  databuf[0x17] = '\0';
  databuf[0x18] = '\0';
  databuf[0x19] = '\0';
  databuf[0x1a] = '\0';
  databuf[0x1b] = '\0';
  databuf[0x1c] = '\0';
  databuf[0x1d] = '\0';
  databuf[0x1e] = '\0';
  databuf[0x1f] = '\0';
  databuf[0] = '\0';
  databuf[1] = '\0';
  databuf[2] = '\0';
  databuf[3] = '\0';
  databuf[4] = '\0';
  databuf[5] = '\0';
  databuf[6] = '\0';
  databuf[7] = '\0';
  databuf[8] = '\0';
  databuf[9] = '\0';
  databuf[10] = '\0';
  databuf[0xb] = '\0';
  databuf[0xc] = '\0';
  databuf[0xd] = '\0';
  databuf[0xe] = '\0';
  databuf[0xf] = '\0';
  databuf[0x50] = '\0';
  databuf[0x51] = '\0';
  databuf[0x52] = '\0';
  databuf[0x53] = '\0';
  iVar6 = GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR,databuf,0x54);
  if (iVar6 == 0) {
    bVar1 = pRPLIDAR->esdata_prev[3];
    bVar2 = pRPLIDAR->esdata_prev[2];
    *pbNewScan = (uint)(bVar1 >> 7);
    dVar16 = (double)((uint)bVar2 | (bVar1 & 0x7f) << 8) * 0.015625;
    dVar15 = (double)((uint)databuf[2] | (databuf[3] & 0x7f) << 8) * 0.015625;
    dVar15 = (double)(~-(ulong)(dVar15 < dVar16) & (ulong)dVar15 |
                     (ulong)(dVar15 + 360.0) & -(ulong)(dVar15 < dVar16)) - dVar16;
    puVar13 = pRPLIDAR->esdata_prev + 8;
    for (lVar12 = -0x20; lVar12 != 0; lVar12 = lVar12 + 2) {
      uVar4 = *(ushort *)(puVar13 + -4);
      bVar1 = puVar13[-1];
      bVar2 = puVar13[-6];
      bVar5 = (puVar13[-4] & 3) << 4;
      bVar9 = *puVar13 & 0xf;
      bVar8 = puVar13[-2] << 4;
      bVar7 = *puVar13 >> 4;
      bVar10 = (bVar9 | bVar5 & 0x1f) + 1;
      if (bVar5 < 0x20) {
        bVar10 = bVar9 | bVar5;
      }
      bVar5 = (bVar7 | bVar8 & 0x1f) + 1;
      if ((bVar8 & 0x30) < 0x20) {
        bVar5 = bVar7 | bVar8 & 0x3f;
      }
      dVar3 = fmod_2PI_deg2rad(-(((double)((int)lVar12 + 0x21) * dVar15 * 0.03125 + dVar16) -
                                (double)bVar10 * 0.125));
      pAngles[lVar12 + 0x20] = dVar3;
      dVar3 = fmod_2PI_deg2rad(-(((double)((int)lVar12 + 0x22) * dVar15 * 0.03125 + dVar16) -
                                (double)bVar5 * 0.125));
      pAngles[lVar12 + 0x21] = dVar3;
      pDistances[lVar12 + 0x20] = (double)(uVar4 >> 2) / 1000.0;
      pDistances[lVar12 + 0x21] = (double)(ushort)(CONCAT11(bVar1,bVar2) >> 2) / 1000.0;
      puVar13 = puVar13 + 5;
    }
    puVar13 = databuf;
    puVar11 = pRPLIDAR->esdata_prev;
    for (lVar12 = 0x54; lVar12 != 0; lVar12 = lVar12 + -1) {
      *puVar11 = *puVar13;
      puVar13 = puVar13 + (ulong)bVar14 * -2 + 1;
      puVar11 = puVar11 + (ulong)bVar14 * -2 + 1;
    }
    iVar6 = 0;
  }
  else {
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

inline int GetExpressScanDataResponseRPLIDAR(RPLIDAR* pRPLIDAR, double* pDistances, double* pAngles, BOOL* pbNewScan)
{
	int j = 0;

#ifdef ENABLE_RPLIDAR_SDK_SUPPORT	
#if !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR+MAX_NB_MEASUREMENTS_PER_SCAN_RPLIDAR];
#else
	sl_lidar_response_measurement_node_hq_t nodes[NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
#endif // !defined(FORCE_RPLIDAR_SDK_V1) || defined(SLAMTEC_LIDAR_SDK_VERSION)
	size_t nodesCount = sizeof(nodes)/sizeof(sl_lidar_response_measurement_node_hq_t);
	size_t nodesRead = 0;
	int nbMeasurements = NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR;
	CHRONO chrono;

	StartChrono(&chrono);

	if (!pRPLIDAR->nodes_cache->empty())
	{
		for (j = 0; j < min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size()); j++)
		{
			nodes[j] = pRPLIDAR->nodes_cache->front();
			pRPLIDAR->nodes_cache->pop_front();
		}
		nodesRead = min(nbMeasurements, (int)pRPLIDAR->nodes_cache->size());
	}
	while ((int)nodesRead < nbMeasurements)
	{
		if (GetTimeElapsedChronoQuick(&chrono) > pRPLIDAR->timeout)
		{
			printf("A RPLIDAR is not responding correctly : getScanDataWithIntervalHq() timeout. \n");
			return EXIT_TIMEOUT;
		}
		nodesCount = nbMeasurements-nodesRead;
		if (SL_IS_FAIL(pRPLIDAR->drv->getScanDataWithIntervalHq(nodes+nodesRead, nodesCount)))
		{
			uSleep(1000);
		}
		else nodesRead += nodesCount;
	}
	if ((int)nodesRead > nbMeasurements)
	{
		for (j = nbMeasurements; j < (int)nodesRead; j++)
		{
			pRPLIDAR->nodes_cache->push_back(nodes[j]);
		}
	}

	// Analyze the data response.
	*pbNewScan = 0;

	//memset(pAngles, 0, nbMeasurements*sizeof(double));
	//memset(pDistances, 0, nbMeasurements*sizeof(double));
	for (j = 0; j < nbMeasurements; j++)
	{
		*pbNewScan = (*pbNewScan) | (nodes[j].flag & SL_LIDAR_RESP_MEASUREMENT_SYNCBIT);

		// Convert in rad.
		pAngles[j] = fmod_2PI_deg2rad(-nodes[j].angle_z_q14*90.0/(1 << 14));

		// Convert in m.
		pDistances[j] = nodes[j].dist_mm_q2/4000.0;
	}
#else
	unsigned char databuf[NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR];
	unsigned short start_angle_q6 = 0;
	unsigned short start_angle_q6_prev = 0;
	unsigned short distance1 = 0;
	unsigned short distance2 = 0;
	char dtheta1_q3 = 0;
	char dtheta2_q3 = 0;
	double dtheta1 = 0;
	double dtheta2 = 0;
	double theta1 = 0;
	double theta2 = 0;

	// Receive the data response.
	memset(databuf, 0, sizeof(databuf));
	if (GetRawExpressScanDataResponseRPLIDAR(pRPLIDAR, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	start_angle_q6 = ((databuf[3] & 0x7F)<<8) | databuf[2];

	// Analyze the previous data response.
	start_angle_q6_prev = ((pRPLIDAR->esdata_prev[3] & 0x7F)<<8) | pRPLIDAR->esdata_prev[2];
	*pbNewScan = pRPLIDAR->esdata_prev[3]>>7;

	//memset(pAngles, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
	//memset(pDistances, 0, NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
	for (j = 0; j < NB_CABINS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR; j++)
	{
		distance1 = ((pRPLIDAR->esdata_prev[4+5*j+1]<<8)|pRPLIDAR->esdata_prev[4+5*j+0])>>2;
		distance2 = ((pRPLIDAR->esdata_prev[4+5*j+3]<<8)|pRPLIDAR->esdata_prev[5*j+2])>>2;
		dtheta1_q3 = ((pRPLIDAR->esdata_prev[4+5*j+0] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4] & 0x0F);
		dtheta2_q3 = ((pRPLIDAR->esdata_prev[4+5*j+2] & 0x03)<<4)|(pRPLIDAR->esdata_prev[4+5*j+4]>>4);
		// Handle the sign bit...
		dtheta1 = ((dtheta1_q3 & 0x20)>>5)? (-~(dtheta1_q3 & 0x1F))/8.0: (dtheta1_q3 & 0x1F)/8.0;
		dtheta2 = ((dtheta2_q3 & 0x20)>>5)? (-~(dtheta2_q3 & 0x1F))/8.0: (dtheta2_q3 & 0x1F)/8.0;

		// k indexes in the formula of the documentation start at 1...
		theta1 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+1)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta1;
		theta2 = start_angle_q6_prev/64.0+AngleDiffRPLIDAR(start_angle_q6_prev/64.0, start_angle_q6/64.0)*(2*j+2)/(NB_MEASUREMENTS_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR)-dtheta2;

		// Convert in rad.
		pAngles[2*j+0] = fmod_2PI_deg2rad(-theta1);
		pAngles[2*j+1] = fmod_2PI_deg2rad(-theta2);

		// Convert in m.
		pDistances[2*j+0] = distance1/1000.0;
		pDistances[2*j+1] = distance2/1000.0;
	}

	memcpy(pRPLIDAR->esdata_prev, databuf, NB_BYTES_EXPRESS_SCAN_DATA_RESPONSE_RPLIDAR);
#endif // ENABLE_RPLIDAR_SDK_SUPPORT

	return EXIT_SUCCESS;
}